

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::splittetrahedron
          (tetgenmesh *this,triface *splittet,int qflag,double *ccent,int chkencflag)

{
  tetrahedron ppdVar1;
  memorypool *pmVar2;
  locateresult lVar3;
  int iVar4;
  arraypool *paVar5;
  long lVar6;
  shellface pc;
  char *this_00;
  point pdVar7;
  int iVar8;
  long lVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_00;
  point newpt;
  double fcent [3];
  double prjpt [3];
  triface local_168;
  face local_158;
  double local_148;
  point local_140;
  insertvertexflags local_138;
  double local_c8 [4];
  flipconstraints local_a8;
  
  lVar9 = 0;
  local_138.refinetet.ver = 0;
  local_138.refinesh.shver = 0;
  local_138.refinetet.tet = (tetrahedron *)0x0;
  local_138.refinesh.sh = (shellface *)0x0;
  local_138.smlenflag = 0;
  local_138.smlen = 0.0;
  local_138.cdtflag = 0;
  local_138.assignmeshsize = 0;
  makepoint(this,&local_140,FREEVOLVERTEX);
  do {
    local_140[lVar9] = ccent[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_168.tet = splittet->tet;
  local_168.ver = splittet->ver;
  if (this->useinsertradius != 0) {
    ppdVar1 = local_168.tet[orgpivot[local_168.ver]];
    local_140[this->pointinsradiusindex] =
         SQRT(((double)ppdVar1[2] - local_140[2]) * ((double)ppdVar1[2] - local_140[2]) +
              ((double)*ppdVar1 - *local_140) * ((double)*ppdVar1 - *local_140) +
              ((double)ppdVar1[1] - local_140[1]) * ((double)ppdVar1[1] - local_140[1]));
  }
  this_00 = (char *)this;
  local_138.iloc = locate(this,local_140,&local_168,1);
  if ((local_138.iloc == ENCSUBFACE) || (local_138.iloc == OUTSIDE)) {
    if (2 < this->b->verbose) {
      this_00 = "    New point %d is blocked by a polygon.\n";
      printf("    New point %d is blocked by a polygon.\n",
             (ulong)*(uint *)((long)local_140 + (long)this->pointmarkindex * 4));
    }
    *(uint *)((long)local_140 + (long)this->pointmarkindex * 4 + 4) =
         *(byte *)((long)local_140 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
    pmVar2 = this->points;
    *local_140 = (double)pmVar2->deaditemstack;
    pmVar2->deaditemstack = local_140;
    pmVar2->items = pmVar2->items + -1;
    iVar8 = 0;
    if (this->b->nobisect == 0) {
      local_158.sh = (shellface *)((ulong)local_168.tet[9][local_168.ver & 3] & 0xfffffffffffffff8);
      local_158.shver = tspivottbl[local_168.ver][(uint)local_168.tet[9][local_168.ver & 3] & 7];
      projpt2face((tetgenmesh *)this_00,ccent,(double *)local_158.sh[3],(double *)local_158.sh[4],
                  (double *)local_158.sh[5],(double *)&local_a8);
      iVar8 = 0;
      lVar3 = slocate(this,(point)&local_a8,&local_158,0,0,1);
      if (lVar3 - ONFACE < 2) {
        pc = local_158.sh[5];
        iVar4 = checkfac4encroach(this,(point)local_158.sh[3],(point)local_158.sh[4],(point)pc,ccent
                                  ,local_c8,&local_148);
        if ((iVar4 != 0) &&
           (iVar4 = splitsubface(this,&local_158,(point)0x0,(point)pc,qflag,local_c8,chkencflag | 2)
           , iVar4 != 0)) {
LAB_00145078:
          repairencfacs(this,chkencflag | 2);
LAB_00145082:
          iVar8 = 1;
          if ((splittet->tet != (tetrahedron *)0x0) && (splittet->tet[4] != (tetrahedron)0x0)) {
            enqueuetetrahedron(this,splittet);
          }
        }
      }
    }
  }
  else {
    iVar8 = this->b->metric;
    local_138.rejflag = (uint)(iVar8 != 0) * 4 + 3;
    local_138.sloc = 0;
    local_138.sbowywat = 0;
    local_138.bowywat = 3;
    local_138.lawson = 2;
    local_138.splitbdflag = 0;
    local_138.validflag = 1;
    local_138.respectbdflag = 1;
    local_138.assignmeshsize = iVar8;
    local_138.refineflag = 1;
    local_138.refinetet.tet = splittet->tet;
    local_138.refinetet.ver = splittet->ver;
    iVar8 = 0;
    pdVar7 = (point)0x0;
    local_138.chkencflag = chkencflag;
    iVar4 = insertpoint(this,local_140,&local_168,(face *)0x0,(face *)0x0,&local_138);
    if (iVar4 == 0) {
      *(uint *)((long)local_140 + (long)this->pointmarkindex * 4 + 4) =
           *(byte *)((long)local_140 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
      pmVar2 = this->points;
      *local_140 = (double)pmVar2->deaditemstack;
      pmVar2->deaditemstack = local_140;
      pmVar2->items = pmVar2->items + -1;
      if (local_138.iloc == ENCSEGMENT) {
        paVar5 = this->encseglist;
        if (((this->b->nobisect == 0) || (this->checkconstraints != 0)) && (0 < paVar5->objects)) {
          lVar9 = 0;
          uVar10 = extraout_XMM0_Da;
          uVar11 = extraout_XMM0_Db;
          do {
            iVar4 = splitsegment(this,(face *)(paVar5->toparray
                                               [(uint)lVar9 >>
                                                ((byte)paVar5->log2objectsperblock & 0x1f)] +
                                              (long)paVar5->objectbytes *
                                              (long)(int)(paVar5->objectsperblockmark & (uint)lVar9)
                                              ),(point)0x0,(double)CONCAT44(uVar11,uVar10),
                                 (point)paVar5->toparray,pdVar7,qflag,chkencflag | 3);
            if (iVar4 != 0) {
              this->encseglist->objects = 0;
              if (0 < this->badsubsegs->items) {
                repairencsegs(this,chkencflag | 3);
              }
              if (this->badsubfacs->items < 1) goto LAB_00145082;
              goto LAB_00145078;
            }
            lVar9 = lVar9 + 1;
            paVar5 = this->encseglist;
            uVar10 = extraout_XMM0_Da_00;
            uVar11 = extraout_XMM0_Db_00;
          } while (lVar9 < paVar5->objects);
        }
      }
      else {
        if (local_138.iloc != ENCSUBFACE) {
          if (local_138.iloc != NEARVERTEX) {
            return 0;
          }
          puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
          puts("  the message above, your input data set, and the exact");
          puts("  command line you used to run this program, thank you.");
          exit(2);
        }
        paVar5 = this->encshlist;
        if (((this->b->nobisect == 0) || (this->checkconstraints != 0)) && (0 < paVar5->objects)) {
          lVar9 = 0;
          do {
            pdVar7 = (point)paVar5->toparray
                            [(uint)lVar9 >> ((byte)paVar5->log2objectsperblock & 0x1f)];
            lVar6 = (long)paVar5->objectbytes *
                    (long)(int)(paVar5->objectsperblockmark & (uint)lVar9);
            iVar4 = splitsubface(this,(face *)((long)pdVar7 + lVar6 + 0x10),(point)0x0,pdVar7,qflag,
                                 (double *)((long)pdVar7 + lVar6 + 0x28),chkencflag | 2);
            if (iVar4 != 0) {
              this->encshlist->objects = 0;
              if (0 < this->badsubfacs->items) goto LAB_00145078;
              goto LAB_00145082;
            }
            lVar9 = lVar9 + 1;
            paVar5 = this->encshlist;
          } while (lVar9 < paVar5->objects);
        }
      }
      paVar5->objects = 0;
    }
    else {
      this->st_volref_count = this->st_volref_count + 1;
      if (0 < this->steinerleft) {
        this->steinerleft = this->steinerleft + -1;
      }
      iVar8 = 1;
      if (this->flipstack != (badface *)0x0) {
        local_a8.seg[0] = (point)0x0;
        local_a8.fac[0] = (point)0x0;
        local_a8.remvert = (point)0x0;
        local_a8.unflip = 0;
        local_a8.collectnewtets = 0;
        local_a8.collectencsegflag = 0;
        local_a8.remove_ndelaunay_edge = 0;
        local_a8.bak_tetprism_vol = 0.0;
        local_a8.tetprism_vol_sum = 0.0;
        local_a8.remove_large_angle = 0;
        local_a8.cosdihed_in = 0.0;
        local_a8.cosdihed_out = 0.0;
        local_a8.checkflipeligibility = 0;
        local_a8.enqflag = 2;
        local_a8.chkencflag = chkencflag;
        lawsonflip3d(this,&local_a8);
        this->unflipqueue->objects = 0;
      }
    }
  }
  return iVar8;
}

Assistant:

int tetgenmesh::splittetrahedron(triface* splittet, int qflag, REAL *ccent, 
                                 int chkencflag)
{
  triface searchtet;
  face *paryseg;
  point newpt, *ppt;
  badface *bface;
  insertvertexflags ivf;
  int splitflag = 0;
  int i;



  REAL rv = 0.; // Insertion radius of 'newpt'.

  makepoint(&newpt, FREEVOLVERTEX);
  for (i = 0; i < 3; i++) newpt[i] = ccent[i];

  if (useinsertradius) {
    rv = distance(newpt, org(*splittet));
    setpointinsradius(newpt, rv);
  }

  // Locate the new point. Starting from an interior point 'q' of the
  //   splittet. We perform a walk from q to the 'newpt', stop walking
  //   either we hit a subface or enter OUTSIDE.
  searchtet = *splittet;
  ivf.iloc = (int) OUTSIDE;
  ivf.iloc = locate(newpt, &searchtet, 1); // 'chkencflag' = 1.

  if ((ivf.iloc == (int) OUTSIDE) || (ivf.iloc == (int) ENCSUBFACE)) {
    // The circumcenter 'c' is not visible from 'q' (the interior of the tet).
// iffalse
    if (b->verbose > 2) {
      printf("    New point %d is blocked by a polygon.\n", pointmark(newpt));
    }
// \fi
    pointdealloc(newpt);  // Do not insert this vertex.
    if (b->nobisect) return 0; // -Y option.
    // There must be a polygon that blocks the visibility.
    // Search a subpolygon that contains the proj(c).
    face searchsh;
    REAL prjpt[3];
    locateresult sloc = OUTSIDE;
    tspivot(searchtet, searchsh);
    ppt = (point *) &(searchsh.sh[3]);
    projpt2face(ccent, ppt[0], ppt[1], ppt[2], prjpt);
    // Locate proj(c) on polygon. 
    sloc = slocate(prjpt, &searchsh, 0, 0, 1);
    if ((sloc == ONEDGE) || (sloc == ONFACE)) {
      // Found a subface/edge containing proj(c).
      // Check if 'c' encoraches upon this subface.
      REAL fcent[3], r = 0;
      ppt = (point *) &(searchsh.sh[3]);
      if (checkfac4encroach(ppt[0], ppt[1], ppt[2], ccent, fcent, &r)) {
        // Encroached. Split this subface.
        splitflag = splitsubface(&searchsh, NULL, org(*splittet), qflag, 
                                 fcent, chkencflag | 2);
        if (splitflag) {
          // Some subfaces may need to be repaired.
          repairencfacs(chkencflag | 2);
        }
      } 
    }
    else if ((sloc == OUTSIDE) || (sloc == ENCSEGMENT)) {
      // Hit a segment. We should split it. 
      // To be done...
    } 
    if (splitflag) {
      // Queue the tet if it is still alive.
      if ((splittet->tet != NULL) && (splittet->tet[4] != NULL)) {
        enqueuetetrahedron(splittet);
      }
    }
    return splitflag;
  }



  // Use Bowyer-Watson algorithm. Preserve subsegments and subfaces;
  ivf.bowywat = 3;
  ivf.lawson = 2;
  ivf.rejflag = 3;  // Do check for encroached segments and subfaces.
  if (b->metric) {
    ivf.rejflag |= 4; // Reject it if it lies in some protecting balls.
  }
  ivf.chkencflag = chkencflag;
  ivf.sloc = ivf.sbowywat = 0; // No use.
  ivf.splitbdflag = 0; // No use.
  ivf.validflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;

  ivf.refineflag = 1;
  ivf.refinetet = *splittet;


  if (insertpoint(newpt, &searchtet, NULL, NULL, &ivf)) {
    // Vertex is inserted.
    st_volref_count++;
    if (steinerleft > 0) steinerleft--;
    if (flipstack != NULL) {
      flipconstraints fc;
      fc.chkencflag = chkencflag;
      fc.enqflag = 2;
      lawsonflip3d(&fc);
      unflipqueue->restart();
    }
    return 1;
  } else {
    // Point is not inserted.
    pointdealloc(newpt);
    // Check if there are encroached segments/subfaces.
    if (ivf.iloc == (int) ENCSEGMENT) {
      if (!b->nobisect || checkconstraints) {  
        // Select an encroached segment and split it.
        for (i = 0; i < encseglist->objects; i++) {
          paryseg = (face *) fastlookup(encseglist, i);
          if (splitsegment(paryseg, NULL, rv, org(*splittet), NULL, qflag, 
                           chkencflag | 3)) {
            splitflag = 1; // A point is inserted on a segment.
            break;
          }
        }
      } // if (!b->nobisect)
      encseglist->restart();
      if (splitflag) {
        // Some segments may need to be repaired.
        if (badsubsegs->items > 0) {
          repairencsegs(chkencflag | 3);
        }
        // Some subfaces may need to be repaired.
        if (badsubfacs->items > 0) {
          repairencfacs(chkencflag | 2);
        }
      }
    } else if (ivf.iloc == (int) ENCSUBFACE) {
      if (!b->nobisect || checkconstraints) {
        // Select an encroached subface and split it.
        for (i = 0; i < encshlist->objects; i++) {
          bface = (badface *) fastlookup(encshlist, i);
          if (splitsubface(&(bface->ss), NULL, org(*splittet), qflag, 
                           bface->cent, chkencflag | 2)){
            splitflag = 1; // A point is inserted on a subface or a segment.
            break;
          }
        }
      } // if (!b->nobisect)
      encshlist->restart();
      if (splitflag) {
        // Some subfaces may need to be repaired.
        if (badsubfacs->items > 0) {
          repairencfacs(chkencflag | 2);
        }
      }
    } else {
      if (ivf.iloc == (int) NEARVERTEX) {
        terminatetetgen(this, 2);
      }
    }
    if (splitflag) {
      // Queue the tet if it is still alive.
      if ((splittet->tet != NULL) && (splittet->tet[4] != NULL)) {
        enqueuetetrahedron(splittet);
      }
    }
    return splitflag;
  }
}